

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void __thiscall QMakeEvaluator::setupProject(QMakeEvaluator *this)

{
  int id;
  ProString *this_00;
  ProString *this_01;
  long in_FS_OFFSET;
  int proFile;
  ProValueMap *vars;
  QMakeEvaluator *in_stack_fffffffffffffd48;
  ProString *str;
  ProKey *in_stack_fffffffffffffd50;
  QMakeEvaluator *in_stack_fffffffffffffd58;
  QMakeEvaluator *this_02;
  ProKey *key;
  QMakeEvaluator *in_stack_fffffffffffffd80;
  ProString local_1f0 [2];
  ProString local_178 [2];
  ProString local_100 [2];
  undefined1 local_a0 [24];
  QFileInfo local_88 [32];
  undefined1 local_68 [96];
  ProString *local_8;
  
  local_8 = *(ProString **)(in_FS_OFFSET + 0x28);
  setTemplate(in_stack_fffffffffffffd80);
  this_00 = (ProString *)ProValueMapStack::top((ProValueMapStack *)0x2fafef);
  id = currentFileId(in_stack_fffffffffffffd48);
  key = (ProKey *)(local_68 + 0x30);
  str = this_00;
  ProKey::ProKey(in_stack_fffffffffffffd50,(char *)this_00);
  this_01 = (ProString *)
            QMap<ProKey,_ProStringList>::operator[]
                      ((QMap<ProKey,_ProStringList> *)in_stack_fffffffffffffd80,key);
  currentFileName(in_stack_fffffffffffffd58);
  QFileInfo::QFileInfo(local_88,(QString *)local_a0);
  QFileInfo::baseName();
  this_02 = (QMakeEvaluator *)local_68;
  ProString::ProString(this_01,&str->m_string);
  ProString::setSource((ProString *)this_02,id);
  ProStringList::operator<<((ProStringList *)this_01,str);
  ProString::~ProString((ProString *)0x2fb0ca);
  QString::~QString((QString *)0x2fb0d4);
  QFileInfo::~QFileInfo(local_88);
  QString::~QString((QString *)0x2fb0e8);
  ProKey::~ProKey((ProKey *)0x2fb0f2);
  ProKey::ProKey((ProKey *)this_01,(char *)str);
  QMap<ProKey,_ProStringList>::operator[]((QMap<ProKey,_ProStringList> *)this_00,key);
  currentFileName(this_02);
  ProString::ProString(this_01,&str->m_string);
  ProString::setSource(local_100,id);
  ProStringList::operator<<((ProStringList *)this_01,str);
  ProString::~ProString((ProString *)0x2fb185);
  QString::~QString((QString *)0x2fb18f);
  ProKey::~ProKey((ProKey *)0x2fb199);
  ProKey::ProKey((ProKey *)this_01,(char *)str);
  QMap<ProKey,_ProStringList>::operator[]((QMap<ProKey,_ProStringList> *)this_00,key);
  currentDirectory(this_02);
  ProString::ProString(this_01,&str->m_string);
  ProString::setSource(local_178,id);
  ProStringList::operator<<((ProStringList *)this_01,str);
  ProString::~ProString((ProString *)0x2fb232);
  QString::~QString((QString *)0x2fb23c);
  ProKey::~ProKey((ProKey *)0x2fb249);
  ProKey::ProKey((ProKey *)this_01,(char *)str);
  QMap<ProKey,_ProStringList>::operator[]((QMap<ProKey,_ProStringList> *)this_00,key);
  ProString::ProString(this_01,&str->m_string);
  ProString::setSource(local_1f0,id);
  ProStringList::operator<<((ProStringList *)this_01,str);
  ProString::~ProString((ProString *)0x2fb2e4);
  ProKey::~ProKey((ProKey *)0x2fb2f1);
  if (*(ProString **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::setupProject()
{
    setTemplate();
    ProValueMap &vars = m_valuemapStack.top();
    int proFile = currentFileId();
    vars[ProKey("TARGET")] << ProString(QFileInfo(currentFileName()).baseName()).setSource(proFile);
    vars[ProKey("_PRO_FILE_")] << ProString(currentFileName()).setSource(proFile);
    vars[ProKey("_PRO_FILE_PWD_")] << ProString(currentDirectory()).setSource(proFile);
    vars[ProKey("OUT_PWD")] << ProString(m_outputDir).setSource(proFile);
}